

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.cpp
# Opt level: O1

bool Diligent::VerifyDrawIndexedAttribs(DrawIndexedAttribs *Attribs)

{
  char (*in_R9) [34];
  string msg;
  string local_38;
  Char *local_18;
  
  if (1 < (byte)(Attribs->IndexType - VT_UINT16)) {
    local_18 = GetValueTypeString(Attribs->IndexType);
    FormatString<char[35],char[12],char_const*,char[34]>
              (&local_38,(Diligent *)"Draw indexed attribs are invalid: ",(char (*) [35])0x357add,
               (char (*) [12])&local_18,(char **)") must be VT_UINT16 or VT_UINT32.",in_R9);
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"VerifyDrawIndexedAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x44);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  if (Attribs->NumIndices == 0) {
    FormatString<char[110]>
              (&local_38,
               (char (*) [110])
               "DrawIndexedAttribs.NumIndices is 0. This is OK as the draw command will be ignored, but may be unintentional."
              );
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(0,local_38._M_dataplus._M_p,0,0,0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  if (Attribs->NumInstances == 0) {
    FormatString<char[105]>(&local_38,(char (*) [105])0x3569b2);
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(0,local_38._M_dataplus._M_p,0,0,0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  return true;
}

Assistant:

bool VerifyDrawIndexedAttribs(const DrawIndexedAttribs& Attribs)
{
#define CHECK_DRAW_INDEXED_ATTRIBS(Expr, ...) CHECK_PARAMETER(Expr, "Draw indexed attribs are invalid: ", __VA_ARGS__)

    CHECK_DRAW_INDEXED_ATTRIBS(Attribs.IndexType == VT_UINT16 || Attribs.IndexType == VT_UINT32,
                               "IndexType (", GetValueTypeString(Attribs.IndexType), ") must be VT_UINT16 or VT_UINT32.");

    if (Attribs.NumIndices == 0)
        LOG_INFO_MESSAGE("DrawIndexedAttribs.NumIndices is 0. This is OK as the draw command will be ignored, but may be unintentional.");
    if (Attribs.NumInstances == 0)
        LOG_INFO_MESSAGE("DrawAttribs.NumInstances is 0. This is OK as the draw command will be ignored, but may be unintentional.");

#undef CHECK_DRAW_INDEXED_ATTRIBS

    return true;
}